

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O0

pair<std::unique_lock<std::mutex>,_std::unordered_map<XrInstance_T_*,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>_>_>_>_&>
* __thiscall
HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::lockMap
          (pair<std::unique_lock<std::mutex>,_std::unordered_map<XrInstance_T_*,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>_>_>_>_&>
           *__return_storage_ptr__,HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo> *this
          )

{
  unique_lock<std::mutex> local_28;
  HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo> *local_18;
  HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo> *this_local;
  
  local_18 = this;
  this_local = (HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo> *)__return_storage_ptr__
  ;
  std::unique_lock<std::mutex>::unique_lock(&local_28,&this->dispatch_mutex_);
  std::
  pair<std::unique_lock<std::mutex>,_std::unordered_map<XrInstance_T_*,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>_>_>_>_&>
  ::pair<std::unique_lock<std::mutex>,_true>(__return_storage_ptr__,&local_28,&this->info_map_);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<UniqueLock, typename HandleInfoBase<HT, IT>::map_t &> HandleInfoBase<HT, IT>::lockMap() {
    return {UniqueLock(dispatch_mutex_), info_map_};
}